

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O1

void __thiscall TinyProcessLib::Process::close_stdin(Process *this)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->stdin_mutex);
  if (iVar2 == 0) {
    piVar1 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if (piVar1 != (int *)0x0) {
      if (0 < (this->data).id) {
        close(*piVar1);
      }
      piVar1 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl = (int *)0x0;
      if (piVar1 != (int *)0x0) {
        operator_delete(piVar1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->stdin_mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  __clang_call_terminate(uVar3);
}

Assistant:

void Process::close_stdin() noexcept {
  std::lock_guard<std::mutex> lock(stdin_mutex);
  if(stdin_fd) {
    if(data.id > 0)
      close(*stdin_fd);
    stdin_fd.reset();
  }
}